

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsViewPrivate::_q_unsetViewportCursor(QGraphicsViewPrivate *this)

{
  QGraphicsView *this_00;
  QGraphicsItem *this_01;
  QWidget *this_02;
  undefined1 *puVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 local_50 [16];
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  auVar6 = QEventPoint::position();
  dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
  bVar2 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_50._0_4_ = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar5)
  ;
  dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
  bVar2 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_50._4_4_ = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar5)
  ;
  QGraphicsView::items((QList<QGraphicsItem_*> *)(local_50 + 8),this_00,(QPoint *)local_50);
  puVar1 = puStack_40;
  if (local_38 != (undefined1 *)0x0) {
    lVar4 = (long)local_38 << 3;
    lVar3 = 0;
    do {
      this_01 = *(QGraphicsItem **)(puVar1 + lVar3);
      bVar2 = QGraphicsItem::isEnabled(this_01);
      if (bVar2) {
        bVar2 = QGraphicsItem::hasCursor(this_01);
        if (bVar2) {
          QGraphicsItem::cursor((QGraphicsItem *)local_50);
          _q_setViewportCursor(this,(QCursor *)local_50);
          goto LAB_0062eba6;
        }
      }
      lVar3 = lVar3 + 8;
    } while (lVar4 != lVar3);
  }
  if (this->hasStoredOriginalCursor == true) {
    this->hasStoredOriginalCursor = false;
    this_02 = (this->super_QAbstractScrollAreaPrivate).viewport;
    if (this->dragMode == ScrollHandDrag) {
      QCursor::QCursor((QCursor *)local_50,OpenHandCursor);
      QWidget::setCursor(this_02,(QCursor *)local_50);
LAB_0062eba6:
      QCursor::~QCursor((QCursor *)local_50);
    }
    else {
      QWidget::setCursor(this_02,&this->originalCursor);
    }
  }
  if ((QGraphicsItemPrivate *)local_50._8_8_ != (QGraphicsItemPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50._8_8_,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::_q_unsetViewportCursor()
{
    Q_Q(QGraphicsView);
    const auto items = q->items(lastMouseEvent->position().toPoint());
    for (QGraphicsItem *item : items) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // Restore the original viewport cursor.
    if (hasStoredOriginalCursor) {
        hasStoredOriginalCursor = false;
        if (dragMode == QGraphicsView::ScrollHandDrag)
            viewport->setCursor(Qt::OpenHandCursor);
        else
            viewport->setCursor(originalCursor);
    }
}